

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QString,QString>::emplace<QString_const&>
          (QHash<QString,QString> *this,QString *key,QString *args)

{
  Data *pDVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
    local_38.d = (Data *)0x0;
LAB_0013bd24:
    QHash<QString,_QString>::detach((QHash<QString,_QString> *)this);
    pVar3 = (piter)emplace_helper<QString_const&>(this,key,args);
    QHash<QString,_QString>::~QHash((QHash<QString,_QString> *)&local_38);
  }
  else {
    if (1 < (uint)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) {
      local_38.d = pDVar1;
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_0013bd24;
    }
    uVar2._0_4_ = pDVar1[1].super_QArrayData.ref_;
    uVar2._4_4_ = pDVar1[1].super_QArrayData.flags;
    if ((ulong)(pDVar1->super_QArrayData).alloc < uVar2 >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar3 = (piter)emplace_helper<QString_const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_0013bdaa;
    }
    local_38.d = (args->d).d;
    local_38.ptr = (args->d).ptr;
    local_38.size = (args->d).size;
    if (local_38.d != (Data *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pVar3 = (piter)QHash<QString,_QString>::emplace_helper<QString>
                             ((QHash<QString,_QString> *)this,key,(QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_0013bdaa:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }